

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDiag.cpp
# Opt level: O0

JsErrorCode
JsDiagGetProperties(uint objectHandle,uint fromCount,uint totalCount,JsValueRef *propertiesObject)

{
  anon_class_32_4_5fd2e34c fn;
  JsErrorCode JVar1;
  uint *in_stack_ffffffffffffffb8;
  JsValueRef *propertiesObject_local;
  uint local_10;
  uint totalCount_local;
  uint fromCount_local;
  uint objectHandle_local;
  
  fn.objectHandle = &local_10;
  fn.propertiesObject = (JsValueRef **)&totalCount_local;
  fn.fromCount = (uint *)((long)&propertiesObject_local + 4);
  fn.totalCount = in_stack_ffffffffffffffb8;
  propertiesObject_local._4_4_ = totalCount;
  local_10 = fromCount;
  totalCount_local = objectHandle;
  JVar1 = ContextAPIWrapper_NoRecord<false,JsDiagGetProperties::__0>(fn);
  return JVar1;
}

Assistant:

CHAKRA_API JsDiagGetProperties(
    _In_ unsigned int objectHandle,
    _In_ unsigned int fromCount,
    _In_ unsigned int totalCount,
    _Out_ JsValueRef *propertiesObject)
{
#ifndef ENABLE_SCRIPT_DEBUGGING
    return JsErrorCategoryUsage;
#else
    return ContextAPIWrapper_NoRecord<false>([&](Js::ScriptContext *scriptContext) -> JsErrorCode {

        PARAM_NOT_NULL(propertiesObject);

        *propertiesObject = JS_INVALID_REFERENCE;

        JsrtContext* context = JsrtContext::GetCurrent();
        JsrtRuntime* runtime = context->GetRuntime();

        VALIDATE_RUNTIME_IS_AT_BREAK(runtime);

        JsrtDebugManager* jsrtDebugManager = runtime->GetJsrtDebugManager();

        VALIDATE_IS_DEBUGGING(jsrtDebugManager);

        JsrtDebuggerObjectBase* debuggerObject = nullptr;
        if (!jsrtDebugManager->GetDebuggerObjectsManager()->TryGetDebuggerObjectFromHandle(objectHandle, &debuggerObject) || debuggerObject == nullptr)
        {
            return JsErrorDiagInvalidHandle;
        }

        Js::DynamicObject* properties = debuggerObject->GetChildren(scriptContext, fromCount, totalCount);

        if (properties != nullptr)
        {
            *propertiesObject = properties;
            return JsNoError;
        }

        return JsErrorDiagUnableToPerformAction;
    });
#endif
}